

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterResult __thiscall
duckdb::FilterCombiner::AddTransitiveFilters
          (FilterCombiner *this,BoundComparisonExpression *comparison,bool is_root)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Base_ptr p_Var1;
  LogicalTypeId LVar2;
  LogicalTypeId type;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Base_ptr *pp_Var4;
  LogicalTypeId LVar5;
  bool bVar6;
  int iVar7;
  FilterResult FVar8;
  type pEVar9;
  Expression *expr;
  Expression *expr_00;
  BoundCastExpression *pBVar10;
  pointer pEVar11;
  BoundColumnRefExpression *pBVar12;
  BoundCastExpression *pBVar13;
  BoundColumnRefExpression *pBVar14;
  idx_t iVar15;
  idx_t iVar16;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar17;
  BoundComparisonExpression *pBVar18;
  ExpressionType EVar19;
  _Base_ptr p_Var20;
  undefined7 in_register_00000011;
  _Base_ptr p_Var21;
  Value *other;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  FilterCombiner *this_01;
  undefined4 uVar24;
  byte bVar25;
  _Hash_node_base *p_Var26;
  ExpressionValueInformation info;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_130;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_128;
  long *local_120;
  undefined4 local_114;
  _Base_ptr local_110;
  FilterCombiner *local_108;
  ulong local_100;
  BoundComparisonExpression *local_f8 [3];
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_e0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_d8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_d0;
  BoundComparisonExpression *local_c8;
  undefined1 local_c0 [72];
  LogicalTypeId local_38;
  undefined4 extraout_var;
  
  uVar24 = (undefined4)CONCAT71(in_register_00000011,is_root);
  EVar19 = (comparison->super_Expression).super_BaseExpression.type;
  if ((((EVar19 & 0xfd) == COMPARE_GREATERTHAN) || (EVar19 == COMPARE_LESSTHANOREQUALTO)) ||
     (FVar8 = UNSUPPORTED, EVar19 == COMPARE_LESSTHAN)) {
    local_d8 = &comparison->left;
    local_c8 = comparison;
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(local_d8);
    expr = GetNode(this,pEVar9);
    local_d0 = &comparison->right;
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(local_d0);
    expr_00 = GetNode(this,pEVar9);
    if ((expr_00->super_BaseExpression).type == OPERATOR_CAST) {
      pBVar10 = BaseExpression::Cast<duckdb::BoundCastExpression>(&expr_00->super_BaseExpression);
      this_00 = &pBVar10->child;
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      if ((pEVar11->super_BaseExpression).type == BOUND_COLUMN_REF) {
        local_110 = (_Base_ptr)this_00;
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        pBVar12 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                            (&pEVar11->super_BaseExpression);
        p_Var26 = (this->stored_expressions)._M_h._M_before_begin._M_nxt;
        local_108 = this;
        if (p_Var26 != (_Hash_node_base *)0x0) {
          local_114 = uVar24;
          do {
            pEVar9 = (type)p_Var26[1]._M_nxt;
            EVar19 = (pEVar9->super_BaseExpression).type;
            if (EVar19 == OPERATOR_CAST) {
              pBVar13 = BaseExpression::Cast<duckdb::BoundCastExpression>
                                  (&expr_00->super_BaseExpression);
              pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator*(&pBVar13->child);
              EVar19 = (pEVar9->super_BaseExpression).type;
            }
            if (((EVar19 == BOUND_COLUMN_REF) &&
                (pBVar14 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                     (&pEVar9->super_BaseExpression),
                (pBVar14->binding).table_index == (pBVar12->binding).table_index)) &&
               ((pBVar14->binding).column_index == (pBVar12->binding).column_index)) {
              pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)(p_Var26 + 2));
              bVar6 = LogicalType::operator==
                                (&(pBVar10->super_Expression).return_type,&pEVar11->return_type);
              if (bVar6) {
                pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)(p_Var26 + 2));
                (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(local_c0,pEVar11);
                uVar17 = local_c0._0_8_;
                p_Var20 = local_110;
                local_c0._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
                _Var3._M_head_impl =
                     (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      &local_110->_M_color)->_M_t).
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                 &local_110->_M_color)->_M_t).
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                     (Expression *)uVar17;
                if ((_Var3._M_head_impl != (Expression *)0x0) &&
                   ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
                   (ClientContext *)local_c0._0_8_ != (ClientContext *)0x0)) {
                  (*((BaseExpression *)local_c0._0_8_)->_vptr_BaseExpression[1])();
                }
                pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)p_Var20);
                this = local_108;
                expr_00 = GetNode(local_108,pEVar9);
                uVar24 = local_114;
                break;
              }
            }
            p_Var26 = p_Var26->_M_nxt;
            this = local_108;
            uVar24 = local_114;
          } while (p_Var26 != (_Hash_node_base *)0x0);
        }
      }
    }
    iVar7 = (*(expr->super_BaseExpression)._vptr_BaseExpression[10])(expr,expr_00);
    FVar8 = UNSUPPORTED;
    if ((char)iVar7 == '\0') {
      iVar15 = GetEquivalenceSet(this,expr);
      iVar16 = GetEquivalenceSet(this,expr_00);
      FVar8 = SUCCESS;
      if (iVar15 != iVar16) {
        p_Var21 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var20 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var22 = p_Var20;
        p_Var23 = p_Var21;
        if (p_Var21 == (_Base_ptr)0x0) {
          local_110 = (_Base_ptr)&this->equivalence_map;
        }
        else {
          do {
            p_Var1 = p_Var23 + 1;
            if (*(ulong *)p_Var1 >= iVar15) {
              p_Var22 = p_Var23;
            }
            pp_Var4 = &p_Var23->_M_left;
            p_Var23 = pp_Var4[*(ulong *)p_Var1 < iVar15];
          } while (pp_Var4[*(ulong *)p_Var1 < iVar15] != (_Base_ptr)0x0);
          p_Var23 = p_Var20;
          local_110 = p_Var20;
          if ((p_Var22 != p_Var20) && (local_110 = p_Var22, iVar15 < *(ulong *)(p_Var22 + 1))) {
            local_110 = p_Var20;
          }
          do {
            if (*(ulong *)(p_Var21 + 1) >= iVar16) {
              p_Var23 = p_Var21;
            }
            p_Var21 = (&p_Var21->_M_left)[*(ulong *)(p_Var21 + 1) < iVar16];
          } while (p_Var21 != (_Base_ptr)0x0);
          local_110 = (_Base_ptr)&local_110[1]._M_parent;
          if ((p_Var23 != p_Var20) && (*(ulong *)(p_Var23 + 1) <= iVar16)) {
            p_Var20 = p_Var23;
          }
        }
        other = (Value *)p_Var20[1]._M_parent;
        local_108 = (FilterCombiner *)p_Var20[1]._M_left;
        FVar8 = UNSUPPORTED;
        if ((FilterCombiner *)other != local_108) {
          local_e0 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&this->remaining_filters;
          bVar25 = 0;
          local_100 = 0;
          local_114 = uVar24;
          do {
            LogicalType::LogicalType((LogicalType *)local_f8,SQLNULL);
            Value::Value((Value *)local_c0,(LogicalType *)local_f8);
            LogicalType::~LogicalType((LogicalType *)local_f8);
            Value::operator=((Value *)local_c0,other);
            LVar2 = other[1].type_.id_;
            type = (local_c8->super_Expression).super_BaseExpression.type;
            LVar5 = type;
            if (LVar2 == VARCHAR) {
LAB_006907d8:
              local_c0[0x40] = LVar5;
              this_01 = (FilterCombiner *)&stack0xffffffffffffff88;
              Value::Value((Value *)this_01,(Value *)local_c0);
              local_38 = local_c0[0x40];
              FVar8 = AddConstantComparison
                                (this_01,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                          *)local_110,
                                 (ExpressionValueInformation *)&stack0xffffffffffffff88);
              Value::~Value((Value *)&stack0xffffffffffffff88);
              bVar25 = 1;
              if (FVar8 == UNSATISFIABLE) {
                Value::~Value((Value *)local_c0);
                return UNSATISFIABLE;
              }
            }
            else {
              switch(type) {
              case INTERVAL:
                if ((LVar2 == USMALLINT) || (LVar2 == INTERVAL)) {
LAB_00690972:
                  if ((local_100 & 1) == 0) {
                    local_c0[0x40] = type;
                    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->(local_d8);
                    (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_120,pEVar11);
                    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->(local_d0);
                    (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_128,pEVar11);
                    pBVar18 = (BoundComparisonExpression *)operator_new(0x68);
                    local_f8[0] = (BoundComparisonExpression *)local_120;
                    local_120 = (long *)0x0;
                    local_130._M_head_impl = local_128._M_head_impl;
                    local_128._M_head_impl = (Expression *)0x0;
                    BoundComparisonExpression::BoundComparisonExpression
                              (pBVar18,type,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_f8,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_130);
                    if (local_130._M_head_impl != (Expression *)0x0) {
                      (*((local_130._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_130._M_head_impl = (Expression *)0x0;
                    if (local_f8[0] != (BoundComparisonExpression *)0x0) {
                      (**(code **)(*(long *)local_f8[0] + 8))();
                    }
                    if (local_128._M_head_impl != (Expression *)0x0) {
                      (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    if (local_120 != (long *)0x0) {
                      (**(code **)(*local_120 + 8))();
                    }
                    local_f8[0] = pBVar18;
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                              (local_e0,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)local_f8);
                    uVar17 = extraout_RAX_00;
                    goto LAB_00690a54;
                  }
                  goto LAB_006907d8;
                }
                break;
              case UTINYINT:
                if ((LVar2 & ~UNKNOWN) == UTINYINT) goto LAB_00690972;
                break;
              case USMALLINT:
                if ((LVar2 == USMALLINT) || (LVar2 == INTERVAL)) {
LAB_00690881:
                  LVar5 = LVar2;
                  if ((local_100 & 1) != 0) goto LAB_006907d8;
                  local_c0[0x40] = LVar2;
                  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_d8);
                  (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_120,pEVar11);
                  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_d0);
                  (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_128,pEVar11);
                  pBVar18 = (BoundComparisonExpression *)operator_new(0x68);
                  local_f8[0] = (BoundComparisonExpression *)local_120;
                  local_120 = (long *)0x0;
                  local_130._M_head_impl = local_128._M_head_impl;
                  local_128._M_head_impl = (Expression *)0x0;
                  BoundComparisonExpression::BoundComparisonExpression
                            (pBVar18,type,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_f8,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_130);
                  if (local_130._M_head_impl != (Expression *)0x0) {
                    (*((local_130._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_130._M_head_impl = (Expression *)0x0;
                  if (local_f8[0] != (BoundComparisonExpression *)0x0) {
                    (**(code **)(*(long *)local_f8[0] + 8))();
                  }
                  if (local_128._M_head_impl != (Expression *)0x0) {
                    (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  if (local_120 != (long *)0x0) {
                    (**(code **)(*local_120 + 8))();
                  }
                  local_f8[0] = pBVar18;
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            (local_e0,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)local_f8);
                  uVar17 = extraout_RAX;
LAB_00690a54:
                  if (local_f8[0] != (BoundComparisonExpression *)0x0) {
                    iVar7 = (*(local_f8[0]->super_Expression).super_BaseExpression.
                              _vptr_BaseExpression[1])();
                    uVar17 = CONCAT44(extraout_var,iVar7);
                  }
                  local_100 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
                  LVar5 = local_c0[0x40];
                  goto LAB_006907d8;
                }
                break;
              case UINTEGER:
                if ((LVar2 & ~UNKNOWN) == UTINYINT) goto LAB_00690881;
              }
            }
            Value::~Value((Value *)local_c0);
            other = (Value *)&other[1].type_.type_info_;
          } while ((FilterCombiner *)other != local_108);
          if (((byte)local_114 & bVar25) == 1) {
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (local_d8);
            FindTransitiveFilter((FilterCombiner *)local_c0,(Expression *)this);
            if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_c0._0_8_ != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
              pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)local_c0);
              pBVar18 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                                  (&pEVar11->super_BaseExpression);
              FVar8 = AddTransitiveFilters(this,pBVar18,false);
              if (FVar8 == UNSATISFIABLE) {
                if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     )local_c0._0_8_ != (Expression *)0x0) {
                  (**(code **)(*(long *)local_c0._0_8_ + 8))();
                }
                return UNSATISFIABLE;
              }
              if (FVar8 == UNSUPPORTED) {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          (local_e0,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                     *)local_c0);
              }
              if ((ClientContext *)local_c0._0_8_ != (ClientContext *)0x0) {
                (*((BaseExpression *)local_c0._0_8_)->_vptr_BaseExpression[1])();
              }
            }
            FVar8 = SUCCESS;
          }
          else {
            FVar8 = UNSUPPORTED - bVar25;
          }
        }
      }
    }
  }
  return FVar8;
}

Assistant:

FilterResult FilterCombiner::AddTransitiveFilters(BoundComparisonExpression &comparison, bool is_root) {
	if (!IsGreaterThan(comparison.GetExpressionType()) && !IsLessThan(comparison.GetExpressionType())) {
		return FilterResult::UNSUPPORTED;
	}
	// get the LHS and RHS nodes
	auto &left_node = GetNode(*comparison.left);
	reference<Expression> right_node = GetNode(*comparison.right);
	// In case with filters like CAST(i) = j and i = 5 we replace the COLUMN_REF i with the constant 5
	do {
		if (right_node.get().GetExpressionType() != ExpressionType::OPERATOR_CAST) {
			break;
		}
		auto &bound_cast_expr = right_node.get().Cast<BoundCastExpression>();
		if (bound_cast_expr.child->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			break;
		}
		auto &col_ref = bound_cast_expr.child->Cast<BoundColumnRefExpression>();
		for (auto &stored_exp : stored_expressions) {
			reference<Expression> expr = stored_exp.first;
			if (expr.get().GetExpressionType() == ExpressionType::OPERATOR_CAST) {
				expr = *(right_node.get().Cast<BoundCastExpression>().child);
			}
			if (expr.get().GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
				continue;
			}
			auto &st_col_ref = expr.get().Cast<BoundColumnRefExpression>();
			if (st_col_ref.binding != col_ref.binding) {
				continue;
			}
			if (bound_cast_expr.return_type != stored_exp.second->return_type) {
				continue;
			}
			bound_cast_expr.child = stored_exp.second->Copy();
			right_node = GetNode(*bound_cast_expr.child);
			break;
		}
	} while (false);

	if (left_node.Equals(right_node)) {
		return FilterResult::UNSUPPORTED;
	}
	// get the equivalence sets of the LHS and RHS
	idx_t left_equivalence_set = GetEquivalenceSet(left_node);
	idx_t right_equivalence_set = GetEquivalenceSet(right_node);
	if (left_equivalence_set == right_equivalence_set) {
		// this equality filter already exists, prune it
		return FilterResult::SUCCESS;
	}

	vector<ExpressionValueInformation> &left_constants = constant_values.find(left_equivalence_set)->second;
	vector<ExpressionValueInformation> &right_constants = constant_values.find(right_equivalence_set)->second;
	bool is_successful = false;
	bool is_inserted = false;
	// read every constant filters already inserted for the right scalar variable
	// and see if we can create new transitive filters, e.g., there is already a filter i > 10,
	// suppose that we have now the j >= i, then we can infer a new filter j > 10
	for (const auto &right_constant : right_constants) {
		ExpressionValueInformation info;
		info.constant = right_constant.constant;
		// there is already an equality filter, e.g., i = 10
		if (right_constant.comparison_type == ExpressionType::COMPARE_EQUAL) {
			// create filter j [>, >=, <, <=] 10
			// suppose the new comparison is j >= i and we have already a filter i = 10,
			// then we create a new filter j >= 10
			// and the filter j >= i can be pruned by not adding it into the remaining filters
			info.comparison_type = comparison.GetExpressionType();
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHANOREQUALTO &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHANOREQUALTO &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j >= i AND i [>, >=] 10) OR (j <= i AND i [<, <=] 10)
			// create filter j [>, >=] 10 and add the filter j [>=, <=] i into the remaining filters
			info.comparison_type = right_constant.comparison_type; // create filter j [>, >=, <, <=] 10
			if (!is_inserted) {
				// Add the filter j >= i in the remaing filters
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHAN &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHAN &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j > i AND i [>, >=] 10) OR j < i AND i [<, <=] 10
			// create filter j [>, <] 10 and add the filter j [>, <] i into the remaining filters
			// the comparisons j > i and j < i are more restrictive
			info.comparison_type = comparison.GetExpressionType();
			if (!is_inserted) {
				// Add the filter j [>, <] i
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else {
			// we cannot add a new filter
			continue;
		}
		// Add the new filer into the left set
		if (AddConstantComparison(left_constants, info) == FilterResult::UNSATISFIABLE) {
			return FilterResult::UNSATISFIABLE;
		}
		is_successful = true;
	}
	if (is_successful) {
		if (is_root) {
			// now check for remaining transitive filters from the left column
			auto transitive_filter = FindTransitiveFilter(*comparison.left);
			if (transitive_filter != nullptr) {
				// try to add transitive filters
				auto &transitive_cast = transitive_filter->Cast<BoundComparisonExpression>();
				auto transitive_result = AddTransitiveFilters(transitive_cast, false);
				if (transitive_result == FilterResult::UNSUPPORTED) {
					// in case of unsuccessful re-add filter into remaining ones
					remaining_filters.push_back(std::move(transitive_filter));
				}
				if (transitive_result == FilterResult::UNSATISFIABLE) {
					// while adding transitive filters we discovered the filter is unsatisfisable - we can prune
					return FilterResult::UNSATISFIABLE;
				}
			}
		}
		return FilterResult::SUCCESS;
	}

	return FilterResult::UNSUPPORTED;
}